

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf_tests.cpp
# Opt level: O3

CTransactionRef __thiscall
rbf_tests::make_tx(rbf_tests *this,
                  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *inputs,vector<long,_std::allocator<long>_> *output_values)

{
  undefined8 *puVar1;
  uchar *puVar2;
  long lVar3;
  pointer plVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer psVar8;
  uint uVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar10;
  ulong uVar11;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar12;
  long lVar13;
  long in_FS_OFFSET;
  CTransactionRef CVar14;
  CMutableTransaction tx;
  CScriptWitness witness;
  unsigned_long local_98;
  CMutableTransaction local_90;
  undefined1 local_58 [28];
  uint uStack_3c;
  element_type *local_38;
  
  local_38 = *(element_type **)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(&local_90);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            (&local_90.vin,
             (long)(inputs->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(inputs->
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            (&local_90.vout,
             (long)(output_values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(output_values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  psVar8 = (inputs->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((inputs->
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar8) {
    lVar13 = 0x50;
    lVar10 = 0;
    uVar11 = 0;
    do {
      lVar3 = *(long *)((long)&(psVar8->
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar10);
      uVar5 = *(undefined8 *)(lVar3 + 0x39);
      uVar6 = *(undefined8 *)(lVar3 + 0x41);
      uVar7 = *(undefined8 *)(lVar3 + 0x51);
      puVar1 = (undefined8 *)
               ((long)(&((local_90.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start)->prevout).hash + -2) + lVar13);
      *puVar1 = *(undefined8 *)(lVar3 + 0x49);
      puVar1[1] = uVar7;
      puVar2 = ((local_90.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
               m_data._M_elems + lVar13 + -0x50;
      *(undefined8 *)puVar2 = uVar5;
      *(undefined8 *)(puVar2 + 8) = uVar6;
      puVar2 = ((local_90.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.
               m_data._M_elems + lVar13 + -0x30;
      puVar2[0] = '\0';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      local_58._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
      local_58._8_8_ = (pointer)0x0;
      local_58._16_8_ = (pointer)0x0;
      local_98 = uVar11 + 10;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::emplace_back<unsigned_long>
                ((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_58,&local_98);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator=((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)(((local_90.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.
                      super_base_blob<256U>.m_data._M_elems + lVar13),
                  (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)local_58);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)local_58);
      uVar11 = uVar11 + 1;
      psVar8 = (inputs->
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 0x10;
      lVar13 = lVar13 + 0x68;
    } while (uVar11 < (ulong)((long)(inputs->
                                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4)
            );
  }
  if ((output_values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (output_values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    lVar10 = 8;
    uVar11 = 0;
    do {
      local_58._16_8_ = (pointer)0x0;
      stack0xffffffffffffffc0 = 0;
      local_58._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
      local_58._8_8_ = (pointer)0x0;
      local_98._0_1_ = 0x5b;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,(iterator)local_58,
                 (uchar *)&local_98);
      uVar9 = uStack_3c - 0x1d;
      if (uStack_3c < 0x1d) {
        uVar9 = uStack_3c;
      }
      ppVar12 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58._0_8_;
      if (uStack_3c < 0x1d) {
        ppVar12 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58;
      }
      local_98 = CONCAT71(local_98._1_7_,0x87);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,
                 (uchar *)((long)&ppVar12->_union + (long)(int)uVar9),(uchar *)&local_98);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 ((long)&(local_90.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                          super__Vector_impl_data._M_start)->nValue + lVar10),
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
      if (0x1c < uStack_3c) {
        free((void *)local_58._0_8_);
      }
      plVar4 = (output_values->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(long *)((long)local_90.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar10 + -8) = plVar4[uVar11];
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x28;
    } while (uVar11 < (ulong)((long)(output_values->super__Vector_base<long,_std::allocator<long>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)plVar4 >> 3))
    ;
  }
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(CTransaction **)this,
             (allocator<CTransaction> *)local_58,&local_90);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_90.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_90.vin);
  if (*(element_type **)(in_FS_OFFSET + 0x28) == local_38) {
    CVar14.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    CVar14.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(in_FS_OFFSET + 0x28);
    return (CTransactionRef)
           CVar14.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

static inline CTransactionRef make_tx(const std::vector<CTransactionRef>& inputs,
                                      const std::vector<CAmount>& output_values)
{
    CMutableTransaction tx = CMutableTransaction();
    tx.vin.resize(inputs.size());
    tx.vout.resize(output_values.size());
    for (size_t i = 0; i < inputs.size(); ++i) {
        tx.vin[i].prevout.hash = inputs[i]->GetHash();
        tx.vin[i].prevout.n = 0;
        // Add a witness so wtxid != txid
        CScriptWitness witness;
        witness.stack.emplace_back(i + 10);
        tx.vin[i].scriptWitness = witness;
    }
    for (size_t i = 0; i < output_values.size(); ++i) {
        tx.vout[i].scriptPubKey = CScript() << OP_11 << OP_EQUAL;
        tx.vout[i].nValue = output_values[i];
    }
    return MakeTransactionRef(tx);
}